

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_option_opts_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  Option *pOVar1;
  undefined8 uVar2;
  size_t sVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  stringstream out;
  allocator<char> local_2c1;
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  local_2c0;
  FormatterBase *local_290;
  string *local_288;
  string local_280;
  Option *local_260;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if ((opt->option_text_)._M_string_length == 0) {
    local_290 = &this->super_FormatterBase;
    if (opt->type_size_min_ != 0) {
      Option::get_type_name_abi_cxx11_((string *)&local_2c0,opt);
      uVar2 = local_2c0._M_impl.super__Rb_tree_header._M_header._0_8_;
      ::std::__cxx11::string::~string((string *)&local_2c0);
      if (uVar2 != 0) {
        poVar4 = ::std::operator<<(&local_1a8," ");
        Option::get_type_name_abi_cxx11_(&local_1d8,opt);
        FormatterBase::get_label((string *)&local_2c0,local_290,&local_1d8);
        ::std::operator<<(poVar4,(string *)&local_2c0);
        ::std::__cxx11::string::~string((string *)&local_2c0);
        ::std::__cxx11::string::~string((string *)&local_1d8);
      }
      ::std::__cxx11::string::string
                ((string *)&local_2c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &opt->default_str_);
      uVar2 = local_2c0._M_impl.super__Rb_tree_header._M_header._0_8_;
      ::std::__cxx11::string::~string((string *)&local_2c0);
      if (uVar2 != 0) {
        poVar4 = ::std::operator<<(&local_1a8," [");
        ::std::__cxx11::string::string
                  ((string *)&local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &opt->default_str_);
        poVar4 = ::std::operator<<(poVar4,(string *)&local_2c0);
        ::std::operator<<(poVar4,"] ");
        ::std::__cxx11::string::~string((string *)&local_2c0);
      }
      if (opt->expected_max_ == 0x20000000) {
        ::std::operator<<(&local_1a8," ...");
      }
      else if (1 < opt->expected_min_) {
        poVar4 = ::std::operator<<(&local_1a8," x ");
        ::std::ostream::operator<<(poVar4,opt->expected_min_);
      }
      if ((opt->super_OptionBase<CLI::Option>).required_ == true) {
        poVar4 = ::std::operator<<(&local_1a8," ");
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,"REQUIRED",(allocator<char> *)&local_280);
        FormatterBase::get_label((string *)&local_2c0,local_290,&local_1f8);
        ::std::operator<<(poVar4,(string *)&local_2c0);
        ::std::__cxx11::string::~string((string *)&local_2c0);
        ::std::__cxx11::string::~string((string *)&local_1f8);
      }
    }
    ::std::__cxx11::string::string
              ((string *)&local_2c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opt->envname_);
    ::std::__cxx11::string::~string((string *)&local_2c0);
    if (local_2c0._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
      poVar4 = ::std::operator<<(&local_1a8," (");
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"Env",&local_2c1);
      FormatterBase::get_label((string *)&local_2c0,local_290,&local_218);
      poVar4 = ::std::operator<<(poVar4,(string *)&local_2c0);
      poVar4 = ::std::operator<<(poVar4,":");
      ::std::__cxx11::string::string
                ((string *)&local_280,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opt->envname_
                );
      poVar4 = ::std::operator<<(poVar4,(string *)&local_280);
      ::std::operator<<(poVar4,")");
      ::std::__cxx11::string::~string((string *)&local_280);
      ::std::__cxx11::string::~string((string *)&local_2c0);
      ::std::__cxx11::string::~string((string *)&local_218);
    }
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::_Rb_tree(&local_2c0,&(opt->needs_)._M_t);
    sVar3 = local_2c0._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::~_Rb_tree(&local_2c0);
    local_288 = __return_storage_ptr__;
    if (sVar3 != 0) {
      poVar4 = ::std::operator<<(&local_1a8," ");
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"Needs",(allocator<char> *)&local_280);
      FormatterBase::get_label((string *)&local_2c0,local_290,&local_238);
      poVar4 = ::std::operator<<(poVar4,(string *)&local_2c0);
      ::std::operator<<(poVar4,":");
      local_260 = opt;
      ::std::__cxx11::string::~string((string *)&local_2c0);
      ::std::__cxx11::string::~string((string *)&local_238);
      std::
      _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
      ::_Rb_tree(&local_2c0,&(opt->needs_)._M_t);
      for (p_Var5 = local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &local_2c0._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)::std::_Rb_tree_increment(p_Var5)) {
        pOVar1 = *(Option **)(p_Var5 + 1);
        poVar4 = ::std::operator<<(&local_1a8," ");
        Option::get_name_abi_cxx11_(&local_280,pOVar1,false,false);
        ::std::operator<<(poVar4,(string *)&local_280);
        ::std::__cxx11::string::~string((string *)&local_280);
      }
      std::
      _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
      ::~_Rb_tree(&local_2c0);
      opt = local_260;
    }
    __return_storage_ptr__ = local_288;
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::_Rb_tree(&local_2c0,&(opt->excludes_)._M_t);
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::~_Rb_tree(&local_2c0);
    if (local_2c0._M_impl.super__Rb_tree_header._M_node_count != 0) {
      poVar4 = ::std::operator<<(&local_1a8," ");
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"Excludes",(allocator<char> *)&local_280);
      FormatterBase::get_label((string *)&local_2c0,local_290,&local_258);
      poVar4 = ::std::operator<<(poVar4,(string *)&local_2c0);
      ::std::operator<<(poVar4,":");
      ::std::__cxx11::string::~string((string *)&local_2c0);
      ::std::__cxx11::string::~string((string *)&local_258);
      std::
      _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
      ::_Rb_tree(&local_2c0,&(opt->excludes_)._M_t);
      for (p_Var5 = local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &local_2c0._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)::std::_Rb_tree_increment(p_Var5)) {
        pOVar1 = *(Option **)(p_Var5 + 1);
        poVar4 = ::std::operator<<(&local_1a8," ");
        Option::get_name_abi_cxx11_(&local_280,pOVar1,false,false);
        ::std::operator<<(poVar4,(string *)&local_280);
        ::std::__cxx11::string::~string((string *)&local_280);
      }
      std::
      _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
      ::~_Rb_tree(&local_2c0);
      __return_storage_ptr__ = local_288;
    }
  }
  else {
    poVar4 = ::std::operator<<(&local_1a8," ");
    ::std::operator<<(poVar4,(string *)&opt->option_text_);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_option_opts(const Option *opt) const {
    std::stringstream out;

    if(!opt->get_option_text().empty()) {
        out << " " << opt->get_option_text();
    } else {
        if(opt->get_type_size() != 0) {
            if(!opt->get_type_name().empty())
                out << " " << get_label(opt->get_type_name());
            if(!opt->get_default_str().empty())
                out << " [" << opt->get_default_str() << "] ";
            if(opt->get_expected_max() == detail::expected_max_vector_size)
                out << " ...";
            else if(opt->get_expected_min() > 1)
                out << " x " << opt->get_expected();

            if(opt->get_required())
                out << " " << get_label("REQUIRED");
        }
        if(!opt->get_envname().empty())
            out << " (" << get_label("Env") << ":" << opt->get_envname() << ")";
        if(!opt->get_needs().empty()) {
            out << " " << get_label("Needs") << ":";
            for(const Option *op : opt->get_needs())
                out << " " << op->get_name();
        }
        if(!opt->get_excludes().empty()) {
            out << " " << get_label("Excludes") << ":";
            for(const Option *op : opt->get_excludes())
                out << " " << op->get_name();
        }
    }
    return out.str();
}